

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

int xmlParse3986Authority(xmlURIPtr uri,char **str)

{
  xmlChar *pxVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  char *cur;
  byte *cur_00;
  bool bVar7;
  byte *local_30;
  
  cur_00 = (byte *)*str;
  pbVar2 = cur_00;
LAB_00188461:
  bVar3 = *pbVar2;
  if ((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) {
    uVar5 = (ulong)(bVar3 - 0x21);
    if (bVar3 - 0x21 < 0x3f) {
      if ((0x4000000016003fe9U >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 != 4) {
          if (uVar5 != 0x1f) goto LAB_001884e6;
          if (uri != (xmlURIPtr)0x0) {
            if (uri->user != (char *)0x0) {
              (*xmlFree)(uri->user);
            }
            iVar6 = (int)pbVar2 - (int)cur_00;
            if ((uri->cleanup & 2) == 0) {
              pxVar1 = (xmlChar *)xmlURIUnescapeString((char *)cur_00,iVar6,(char *)0x0);
            }
            else {
              pxVar1 = xmlStrndup(cur_00,iVar6);
            }
            uri->user = (char *)pxVar1;
            if (*pbVar2 != 0x40) {
              cur_00 = (byte *)*str;
              goto LAB_0018853b;
            }
          }
          cur_00 = pbVar2 + 1;
LAB_0018853b:
          bVar3 = *cur_00;
          if (bVar3 == 0x5b) {
            local_30 = cur_00 + 1;
            do {
              bVar3 = *local_30;
              if (bVar3 == 0) {
                return 1;
              }
              local_30 = local_30 + 1;
            } while (bVar3 != 0x5d);
LAB_00188669:
            if (uri != (xmlURIPtr)0x0) {
              if (uri->authority != (char *)0x0) {
                (*xmlFree)(uri->authority);
              }
              uri->authority = (char *)0x0;
              if (uri->server != (char *)0x0) {
                (*xmlFree)(uri->server);
              }
              pbVar2 = local_30;
              if (local_30 == cur_00) {
                uri->server = (char *)0x0;
                local_30 = pbVar2;
              }
              else {
                iVar6 = (int)local_30 - (int)cur_00;
                if ((uri->cleanup & 2) == 0) {
                  pxVar1 = (xmlChar *)xmlURIUnescapeString((char *)cur_00,iVar6,(char *)0x0);
                }
                else {
                  pxVar1 = xmlStrndup(cur_00,iVar6);
                }
                uri->server = (char *)pxVar1;
                local_30 = pbVar2;
              }
            }
            if (*local_30 == 0x3a) {
              bVar3 = local_30[1];
              if (9 < (byte)(bVar3 - 0x30)) {
                return 1;
              }
              iVar6 = 0;
              pbVar2 = local_30;
              while( true ) {
                local_30 = pbVar2 + 1;
                bVar3 = bVar3 - 0x30;
                if (9 < bVar3) break;
                if (0xccccccc < iVar6) {
                  return 1;
                }
                if ((int)(bVar3 ^ 0x7fffffff) < iVar6 * 10) {
                  return 1;
                }
                iVar6 = iVar6 * 10 + (uint)bVar3;
                bVar3 = pbVar2[2];
                pbVar2 = local_30;
              }
              if (uri != (xmlURIPtr)0x0) {
                uri->port = iVar6;
              }
            }
            *str = (char *)local_30;
            return 0;
          }
          pbVar2 = cur_00;
          if ((((byte)(bVar3 - 0x30) < 10) &&
              (local_30 = cur_00, iVar6 = xmlParse3986DecOctet((char **)&local_30), iVar6 == 0)) &&
             (*local_30 == 0x2e)) {
            local_30 = local_30 + 1;
            iVar6 = xmlParse3986DecOctet((char **)&local_30);
            if (((iVar6 == 0) && (*local_30 == 0x2e)) &&
               ((iVar6 = xmlParse3986DecOctet((char **)&local_30), iVar6 == 0 &&
                ((*local_30 == 0x2e &&
                 (iVar6 = xmlParse3986DecOctet((char **)&local_30), iVar6 == 0))))))
            goto LAB_00188669;
          }
          do {
            if ((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) {
              uVar4 = bVar3 - 0x21;
              local_30 = pbVar2;
              if (uVar4 < 0x3f) {
                if ((0x4000000014003fe9U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
                  if ((ulong)uVar4 != 4) goto LAB_0018865f;
                  if (((9 < (byte)(pbVar2[1] - 0x30)) &&
                      ((uVar4 = pbVar2[1] - 0x41, 0x25 < uVar4 ||
                       ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) ||
                     ((9 < (byte)(pbVar2[2] - 0x30) &&
                      ((uVar4 = pbVar2[2] - 0x41, 0x25 < uVar4 ||
                       ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) == 0)))))) goto LAB_00188669;
                }
              }
              else {
LAB_0018865f:
                if (bVar3 != 0x7e) goto LAB_00188669;
              }
            }
            bVar7 = bVar3 == 0x25;
            bVar3 = pbVar2[(ulong)bVar7 * 2 + 1];
            pbVar2 = pbVar2 + (ulong)bVar7 * 2 + 1;
          } while( true );
        }
        if (((9 < (byte)(pbVar2[1] - 0x30)) &&
            ((uVar4 = pbVar2[1] - 0x41, 0x25 < uVar4 ||
             ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) ||
           ((9 < (byte)(pbVar2[2] - 0x30) &&
            ((uVar4 = pbVar2[2] - 0x41, 0x25 < uVar4 ||
             ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) == 0)))))) goto LAB_0018853b;
      }
    }
    else {
LAB_001884e6:
      if (bVar3 != 0x7e) goto LAB_0018853b;
    }
  }
  pbVar2 = pbVar2 + (ulong)(bVar3 == 0x25) * 2 + 1;
  goto LAB_00188461;
}

Assistant:

static int
xmlParse3986Authority(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;
    /*
     * try to parse an userinfo and check for the trailing @
     */
    ret = xmlParse3986Userinfo(uri, &cur);
    if ((ret != 0) || (*cur != '@'))
        cur = *str;
    else
        cur++;
    ret = xmlParse3986Host(uri, &cur);
    if (ret != 0) return(ret);
    if (*cur == ':') {
        cur++;
        ret = xmlParse3986Port(uri, &cur);
	if (ret != 0) return(ret);
    }
    *str = cur;
    return(0);
}